

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring_bitmap_get_cardinality(roaring_bitmap_t *r)

{
  int iVar1;
  int *in_RDI;
  int i;
  uint64_t card;
  roaring_array_t *ra;
  container_t *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  undefined8 local_18;
  
  local_18 = 0;
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    iVar1 = container_get_cardinality(in_stack_ffffffffffffffd8,'\0');
    local_18 = (long)iVar1 + local_18;
  }
  return local_18;
}

Assistant:

uint64_t roaring_bitmap_get_cardinality(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    uint64_t card = 0;
    for (int i = 0; i < ra->size; ++i)
        card += container_get_cardinality(ra->containers[i], ra->typecodes[i]);
    return card;
}